

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
fmt::v8::detail::specs_handler<wchar_t>::get_arg
          (format_arg *__return_storage_ptr__,specs_handler<wchar_t> *this)

{
  uint uVar1;
  buffer_context<wchar_t> *this_00;
  
  uVar1 = this->parse_context_->next_arg_id_;
  if (-1 < (int)uVar1) {
    this_00 = this->context_;
    this->parse_context_->next_arg_id_ = uVar1 + 1;
    get_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>,int>
              (__return_storage_ptr__,(detail *)this_00,
               (basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>
                *)(ulong)uVar1,uVar1 + 1);
    return __return_storage_ptr__;
  }
  fmt::v8::detail::throw_format_error("cannot switch from manual to automatic argument indexing");
}

Assistant:

FMT_CONSTEXPR auto get_arg(auto_id) -> format_arg {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }